

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  BYTE *source;
  BYTE *pBVar2;
  int iVar3;
  uint maxNbBits;
  size_t err_code_2;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  HUF_repeat HVar7;
  ulong uVar8;
  long lVar9;
  ulong sourceSize;
  size_t err_code;
  symbolEncodingType_e sVar10;
  undefined8 uVar11;
  ZSTD_symbolEncodingTypeStats_t local_60;
  ZSTD_CCtx_params *local_38;
  
  source = seqStorePtr->litStart;
  pBVar2 = seqStorePtr->lit;
  ZVar1 = (cctxParams->cParams).strategy;
  local_38 = cctxParams;
  iVar3 = ZSTD_literalsCompressionIsDisabled(cctxParams);
  local_60.LLtype = 0xff;
  HVar7 = (prevEntropy->huf).repeatMode;
  memcpy(nextEntropy,prevEntropy,0x810);
  sVar10 = set_basic;
  if (iVar3 == 0) {
    sourceSize = (long)pBVar2 - (long)source;
    uVar8 = 0x3f;
    if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
      uVar8 = 6;
    }
    if (sourceSize <= uVar8) goto LAB_00625715;
    sVar4 = HIST_count_wksp((uint *)workspace,&local_60.LLtype,source,sourceSize,workspace,wkspSize)
    ;
    if (0xffffffffffffff88 < sVar4) {
LAB_0062598c:
      (entropyMetadata->hufMetadata).hufDesSize = sVar4;
      return sVar4;
    }
    if (sVar4 == sourceSize) {
      sVar10 = set_rle;
      goto LAB_00625715;
    }
    if (sVar4 <= (sourceSize >> 7) + 4) goto LAB_00625715;
    workSpace = (void *)((long)workspace + 0x400);
    sVar6 = wkspSize - 0x400;
    if (HVar7 == HUF_repeat_check) {
      iVar3 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,local_60.LLtype);
      HVar7 = (HUF_repeat)(iVar3 != 0);
    }
    memset(nextEntropy,0,0x808);
    maxNbBits = HUF_optimalTableLog(0xb,sourceSize,local_60.LLtype,workSpace,sVar6,
                                    (HUF_CElt *)nextEntropy,(uint *)workspace,
                                    (uint)(ZSTD_btopt < ZVar1) * 2);
    if (0xb < maxNbBits) {
      __assert_fail("huffLog <= LitHufLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xdd5,
                    "size_t ZSTD_buildBlockEntropyStats_literals(void *const, size_t, const ZSTD_hufCTables_t *, ZSTD_hufCTables_t *, ZSTD_hufCTablesMetadata_t *, const int, void *, size_t, int)"
                   );
    }
    sVar4 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,local_60.LLtype,maxNbBits,workSpace
                       ,sVar6);
    if (0xffffffffffffff88 < sVar4) goto LAB_0062598c;
    sVar5 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,local_60.LLtype);
    sVar4 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       local_60.LLtype,(uint)sVar4,workSpace,sVar6);
    if (((HVar7 != HUF_repeat_none) &&
        (sVar6 = HUF_estimateCompressedSize
                           ((HUF_CElt *)prevEntropy,(uint *)workspace,local_60.LLtype),
        sVar6 < sourceSize)) && (sourceSize <= sVar4 + 0xc || sVar6 <= sVar4 + sVar5)) {
      sVar10 = set_repeat;
LAB_0062599c:
      memcpy(nextEntropy,prevEntropy,0x810);
      goto LAB_00625715;
    }
    sVar10 = set_basic;
    if (sourceSize <= sVar5 + sVar4) goto LAB_0062599c;
    (entropyMetadata->hufMetadata).hType = set_compressed;
    (nextEntropy->huf).repeatMode = HUF_repeat_check;
    (entropyMetadata->hufMetadata).hufDesSize = sVar4;
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
  }
  else {
LAB_00625715:
    (entropyMetadata->hufMetadata).hType = sVar10;
    (entropyMetadata->hufMetadata).hufDesSize = 0;
  }
  lVar9 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
  if (lVar9 == 0) {
    (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
    (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    uVar11 = 0;
    local_60.MLtype = set_basic;
    local_60.size = 0;
    local_60.lastCountSize = 0;
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_60,seqStorePtr,lVar9 >> 3,&prevEntropy->fse,&nextEntropy->fse,
               (entropyMetadata->fseMetadata).fseTablesBuffer,
               &(entropyMetadata->fseMetadata).field_0x91,(local_38->cParams).strategy,
               (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    if (0xffffffffffffff88 < local_60.size) goto LAB_006257e0;
    uVar11 = CONCAT44(local_60.Offtype,local_60.LLtype);
  }
  (entropyMetadata->fseMetadata).llType = (int)uVar11;
  (entropyMetadata->fseMetadata).ofType = (int)((ulong)uVar11 >> 0x20);
  (entropyMetadata->fseMetadata).mlType = local_60.MLtype;
  (entropyMetadata->fseMetadata).lastCountSize = local_60.lastCountSize;
LAB_006257e0:
  (entropyMetadata->fseMetadata).fseTablesSize = local_60.size;
  uVar8 = 0;
  if (0xffffffffffffff88 < local_60.size) {
    uVar8 = local_60.size;
  }
  return uVar8;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}